

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O3

int anon_unknown.dwarf_25bab::ChannelOut_mono(lua_State *L)

{
  long *plVar1;
  ulong uVar2;
  char local_1b [3];
  
  plVar1 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  uVar2 = luaL_optinteger(L,2,0);
  if (0x10 < uVar2) {
    luaL_argerror(L,2,"Channel count must be between 0 and 16");
  }
  local_1b[0] = (char)plVar1[1] + -0x50;
  local_1b[1] = 0x7e;
  local_1b[2] = (char)uVar2;
  (**(code **)(**(long **)(*plVar1 + 8) + 0x58))(*(long **)(*plVar1 + 8),local_1b,3);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_mono(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer m = luaL_optinteger(L, 2, 0);
	luaL_argcheck(L, m >= 0 && m <= 16, 2, "Channel count must be between 0 and 16");
	self.send(0xB0 + self.index, 0x7E, m);
	lua_settop(L, 1);
	return 1;
}